

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

TextureFormat tcu::getUncompressedFormat(CompressedTexFormat format)

{
  bool bVar1;
  TextureFormat TStack_10;
  CompressedTexFormat format_local;
  
  bVar1 = isEtcFormat(format);
  if (bVar1) {
    switch(format) {
    case COMPRESSEDTEXFORMAT_ETC1_RGB8:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNORM_INT8);
      break;
    case COMPRESSEDTEXFORMAT_EAC_R11:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNORM_INT16);
      break;
    case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SNORM_INT16);
      break;
    case COMPRESSEDTEXFORMAT_EAC_RG11:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNORM_INT16);
      break;
    case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SNORM_INT16);
      break;
    case COMPRESSEDTEXFORMAT_ETC2_RGB8:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNORM_INT8);
      break;
    case COMPRESSEDTEXFORMAT_ETC2_SRGB8:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sRGB,UNORM_INT8);
      break;
    case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_INT8);
      break;
    case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sRGBA,UNORM_INT8);
      break;
    case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_INT8);
      break;
    case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sRGBA,UNORM_INT8);
      break;
    default:
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0);
    }
  }
  else {
    bVar1 = isAstcFormat(format);
    if (bVar1) {
      bVar1 = isAstcSRGBFormat(format);
      if (bVar1) {
        TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sRGBA,UNORM_INT8);
      }
      else {
        TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,HALF_FLOAT);
      }
    }
    else {
      TextureFormat::TextureFormat(&stack0xfffffffffffffff0);
    }
  }
  return TStack_10;
}

Assistant:

TextureFormat getUncompressedFormat (CompressedTexFormat format)
{
	if (isEtcFormat(format))
	{
		switch (format)
		{
			case COMPRESSEDTEXFORMAT_ETC1_RGB8:							return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT8);
			case COMPRESSEDTEXFORMAT_EAC_R11:							return TextureFormat(TextureFormat::R,		TextureFormat::UNORM_INT16);
			case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:					return TextureFormat(TextureFormat::R,		TextureFormat::SNORM_INT16);
			case COMPRESSEDTEXFORMAT_EAC_RG11:							return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_INT16);
			case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:					return TextureFormat(TextureFormat::RG,		TextureFormat::SNORM_INT16);
			case COMPRESSEDTEXFORMAT_ETC2_RGB8:							return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT8);
			case COMPRESSEDTEXFORMAT_ETC2_SRGB8:						return TextureFormat(TextureFormat::sRGB,	TextureFormat::UNORM_INT8);
			case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);
			case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:	return TextureFormat(TextureFormat::sRGBA,	TextureFormat::UNORM_INT8);
			case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:					return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);
			case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:				return TextureFormat(TextureFormat::sRGBA,	TextureFormat::UNORM_INT8);

			default:
				DE_ASSERT(false);
				return TextureFormat();
		}
	}
	else if (isAstcFormat(format))
	{
		if (isAstcSRGBFormat(format))
			return TextureFormat(TextureFormat::sRGBA, TextureFormat::UNORM_INT8);
		else
			return TextureFormat(TextureFormat::RGBA, TextureFormat::HALF_FLOAT);
	}
	else
	{
		DE_ASSERT(false);
		return TextureFormat();
	}
}